

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ATN.hpp
# Opt level: O2

pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
* __thiscall
Centaurus::ATNPrinter<unsigned_char>::print_atn_abi_cxx11_
          (pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
           *__return_storage_ptr__,ATNPrinter<unsigned_char> *this,wostream *os,int index,
          Identifier *key)

{
  Identifier *__x;
  int __val;
  pointer pIVar1;
  pointer pIVar2;
  pointer pAVar3;
  pointer ppVar4;
  wostream *pwVar5;
  mapped_type *pmVar6;
  __normal_iterator<Centaurus::Identifier_*,_std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>_>
  _Var7;
  pointer pAVar8;
  uint uVar9;
  ATNTransition<unsigned_char> *t;
  ulong uVar10;
  pointer pAVar11;
  ATNNode<unsigned_char> *this_00;
  pointer pAVar12;
  pointer ppVar13;
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  entry_exit_nodes;
  wstring exit_node;
  wstring prefix;
  wstring local_b0;
  wstring entry_node;
  wstring local_50;
  
  __val = this->m_counter;
  this->m_counter = __val + 1;
  std::__cxx11::to_wstring(&entry_node,__val);
  std::operator+(&prefix,&key->m_id,&entry_node);
  std::__cxx11::wstring::~wstring((wstring *)&entry_node);
  pwVar5 = std::operator<<(os,L"subgraph cluster_");
  pwVar5 = std::operator<<(pwVar5,(wstring *)&prefix);
  pwVar5 = std::operator<<(pwVar5,L" {");
  std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar5);
  pmVar6 = std::__detail::
           _Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::at((_Map_base<Centaurus::Identifier,_std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>,_std::allocator<std::pair<const_Centaurus::Identifier,_Centaurus::ATNMachine<unsigned_char>_>_>,_std::__detail::_Select1st,_std::equal_to<Centaurus::Identifier>,_std::hash<Centaurus::Identifier>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 *)this->m_networks,key);
  std::
  vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  ::vector(&entry_exit_nodes,
           ((long)(pmVar6->m_nodes).
                  super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
           (long)(pmVar6->m_nodes).
                 super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_start) / 0x98,(allocator_type *)&entry_node);
  uVar9 = 0;
  do {
    uVar10 = (ulong)uVar9;
    pAVar12 = (pmVar6->m_nodes).
              super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pAVar8 = (pmVar6->m_nodes).
             super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((ulong)(((long)pAVar8 - (long)pAVar12) / 0x98) <= uVar10) {
      for (uVar9 = 0; uVar10 = (ulong)uVar9, uVar10 < (ulong)(((long)pAVar8 - (long)pAVar12) / 0x98)
          ; uVar9 = uVar9 + 1) {
        ppVar4 = entry_exit_nodes.
                 super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar10;
        pAVar3 = pAVar12[uVar10].m_transitions.
                 super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (pAVar11 = *(pointer *)
                        &pAVar12[uVar10].m_transitions.
                         super__Vector_base<Centaurus::ATNTransition<unsigned_char>,_std::allocator<Centaurus::ATNTransition<unsigned_char>_>_>
                         ._M_impl; pAVar11 != pAVar3; pAVar11 = pAVar11 + 1) {
          ppVar13 = entry_exit_nodes.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + pAVar11->m_dest;
          pwVar5 = std::operator<<(os,(wstring *)&ppVar4->second);
          pwVar5 = std::operator<<(pwVar5,L" -> ");
          pwVar5 = std::operator<<(pwVar5,(wstring *)ppVar13);
          std::operator<<(pwVar5,L" [ label=\"");
          pwVar5 = std::operator<<(os,L"\" ];");
          std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar5);
        }
        pAVar12 = (pmVar6->m_nodes).
                  super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pAVar8 = (pmVar6->m_nodes).
                 super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      }
      pwVar5 = std::operator<<(os,L"label = \"[");
      pwVar5 = (wostream *)std::wostream::operator<<((wostream *)pwVar5,index);
      pwVar5 = std::operator<<(pwVar5,L"]");
      pwVar5 = std::operator<<(pwVar5,(wstring *)&key->m_id);
      pwVar5 = std::operator<<(pwVar5,L"\";");
      std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar5);
      pwVar5 = std::operator<<(os,L"}");
      std::endl<wchar_t,std::char_traits<wchar_t>>(pwVar5);
      std::operator+(&entry_node,&prefix,L"_N0");
      std::operator+(&local_b0,&prefix,L"_N");
      std::__cxx11::to_wstring
                (&local_50,
                 ((long)(pmVar6->m_nodes).
                        super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)(pmVar6->m_nodes).
                       super__Vector_base<Centaurus::ATNNode<unsigned_char>,_std::allocator<Centaurus::ATNNode<unsigned_char>_>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x98 - 1);
      std::operator+(&exit_node,&local_b0,&local_50);
      std::__cxx11::wstring::~wstring((wstring *)&local_50);
      std::__cxx11::wstring::~wstring((wstring *)&local_b0);
      std::
      pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::
      pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_&,_true>
                (__return_storage_ptr__,&entry_node,&exit_node);
      std::__cxx11::wstring::~wstring((wstring *)&exit_node);
      std::__cxx11::wstring::~wstring((wstring *)&entry_node);
      std::
      vector<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
      ::~vector(&entry_exit_nodes);
      std::__cxx11::wstring::~wstring((wstring *)&prefix);
      return __return_storage_ptr__;
    }
    std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &entry_node,&prefix,L"_N");
    std::__cxx11::to_wstring(&local_b0,uVar9);
    std::operator+(&exit_node,
                   (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                   &entry_node,&local_b0);
    this_00 = pAVar12 + uVar10;
    std::__cxx11::wstring::~wstring((wstring *)&local_b0);
    std::__cxx11::wstring::~wstring((wstring *)&entry_node);
    if (this_00->m_type == Nonterminal) {
      pIVar1 = (this->m_stack).
               super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      pIVar2 = (this->m_stack).
               super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>.
               _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)(long)this->m_maxdepth <= (ulong)(((long)pIVar1 - (long)pIVar2) / 0x28)) {
LAB_00144ce8:
        ATNNode<unsigned_char>::get_entry_exit_wide
                  ((pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                    *)&entry_node,this_00,&exit_node);
        goto LAB_00144d0a;
      }
      __x = &this_00->m_invoke;
      _Var7 = std::
              __find_if<__gnu_cxx::__normal_iterator<Centaurus::Identifier*,std::vector<Centaurus::Identifier,std::allocator<Centaurus::Identifier>>>,__gnu_cxx::__ops::_Iter_equals_val<Centaurus::Identifier_const>>
                        (pIVar2,pIVar1,__x);
      if (_Var7._M_current !=
          (this->m_stack).
          super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_00144ce8;
      std::vector<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>::push_back
                (&this->m_stack,__x);
      print_atn_abi_cxx11_
                ((pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                  *)&entry_node,this,os,uVar9,__x);
      std::
      pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::operator=(entry_exit_nodes.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar10,
                  (pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                   *)&entry_node);
      std::
      pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::~pair((pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *)&entry_node);
      pIVar1 = (this->m_stack).
               super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>.
               _M_impl.super__Vector_impl_data._M_finish;
      (this->m_stack).
      super__Vector_base<Centaurus::Identifier,_std::allocator<Centaurus::Identifier>_>._M_impl.
      super__Vector_impl_data._M_finish = pIVar1 + -1;
      (**pIVar1[-1]._vptr_Identifier)();
    }
    else {
      ATNNode<unsigned_char>::get_entry_exit_wide
                ((pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                  *)&entry_node,this_00,&exit_node);
LAB_00144d0a:
      std::
      pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::operator=(entry_exit_nodes.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + uVar10,
                  (pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                   *)&entry_node);
      std::
      pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
      ::~pair((pair<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
               *)&entry_node);
      ATNNode<unsigned_char>::print(this_00,os,uVar9,&exit_node);
    }
    std::__cxx11::wstring::~wstring((wstring *)&exit_node);
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

std::pair<std::wstring, std::wstring> print_atn(std::wostream& os, int index, const Identifier& key)
	{
		std::wstring prefix = key + std::to_wstring(m_counter++);

		os << L"subgraph cluster_" << prefix << L" {" << std::endl;

		const ATNMachine<TCHAR>& atn = m_networks.at(key);

		std::vector<std::pair<std::wstring, std::wstring> > entry_exit_nodes(atn.m_nodes.size());

		for (unsigned int i = 0; i < atn.m_nodes.size(); i++)
		{
			const ATNNode<TCHAR>& node = atn.m_nodes[i];
			std::wstring node_name = prefix + L"_N" + std::to_wstring(i);

			if (node.is_nonterminal())
			{
				if (m_stack.size() < (size_t)m_maxdepth && std::find(m_stack.begin(), m_stack.end(), node.m_invoke) == m_stack.end())
				{
					m_stack.push_back(node.m_invoke);
					entry_exit_nodes[i] = print_atn(os, i, node.m_invoke);
					m_stack.pop_back();
				}
				else
				{
					entry_exit_nodes[i] = node.get_entry_exit_wide(node_name);
					node.print(os, i, node_name);
				}
			}
			else
			{
				entry_exit_nodes[i] = node.get_entry_exit_wide(node_name);
				node.print(os, i, node_name);
			}
		}

		for (unsigned int i = 0; i < atn.m_nodes.size(); i++)
		{
			const ATNNode<TCHAR>& node = atn.m_nodes[i];
			const std::wstring& exit = entry_exit_nodes[i].second;
			for (const auto& t : node.m_transitions)
			{
				const std::wstring& entry = entry_exit_nodes[t.dest()].first;

				os << exit << L" -> " << entry << L" [ label=\"";
				os << t;
				os << L"\" ];" << std::endl;
			}
		}

		os << L"label = \"[" << index << L"]" << key << L"\";" << std::endl;
		os << L"}" << std::endl;

		std::wstring entry_node = prefix + L"_N0";
		std::wstring exit_node = prefix + L"_N" + std::to_wstring(atn.m_nodes.size() - 1);

		return std::pair<std::wstring, std::wstring>(entry_node, exit_node);
	}